

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O3

void __thiscall RTree_node::~RTree_node(RTree_node *this)

{
  Polygon *pPVar1;
  RTree_node *this_00;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = this->elements;
  if (this->is_leaf == false) {
    if (0 < iVar2) {
      pdVar3 = (this->data_internal_node).
               super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      lVar5 = 0;
      do {
        this_00 = *(RTree_node **)((long)&pdVar3->child + lVar6);
        if (this_00 != (RTree_node *)0x0) {
          ~RTree_node(this_00);
        }
        operator_delete(this_00,0x48);
        pdVar3 = (this->data_internal_node).
                 super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pdVar3->child + lVar6) = 0;
        pPVar1 = *(Polygon **)((long)&pdVar3->region + lVar6);
        if (pPVar1 != (Polygon *)0x0) {
          Polygon::~Polygon(pPVar1);
        }
        operator_delete(pPVar1,0x38);
        pdVar3 = (this->data_internal_node).
                 super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pdVar3->region + lVar6) = 0;
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar5 < this->elements);
    }
  }
  else if (0 < iVar2) {
    pdVar4 = (this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    lVar5 = 0;
    do {
      pPVar1 = *(Polygon **)((long)&pdVar4->polygon + lVar6);
      if (pPVar1 != (Polygon *)0x0) {
        Polygon::~Polygon(pPVar1);
        operator_delete(pPVar1,0x38);
        pdVar4 = (this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pdVar4->polygon + lVar6) = 0;
        pPVar1 = *(Polygon **)((long)&pdVar4->region + lVar6);
        if (pPVar1 != (Polygon *)0x0) {
          Polygon::~Polygon(pPVar1);
        }
        operator_delete(pPVar1,0x38);
        pdVar4 = (this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pdVar4->region + lVar6) = 0;
        iVar2 = this->elements;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < iVar2);
  }
  pdVar3 = (this->data_internal_node).
           super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)(this->data_internal_node).
                                 super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
  }
  pdVar4 = (this->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar4 == (pointer)0x0) {
    return;
  }
  operator_delete(pdVar4,(long)(this->data_leafs).
                               super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage - (long)pdVar4);
  return;
}

Assistant:

RTree_node::~RTree_node(){
    if(!this->is_leaf){
        for(int i = 0; i < this->elements; i++){
            delete this->data_internal_node[i].child;
            this->data_internal_node[i].child = nullptr;
            delete this->data_internal_node[i].region;
            this->data_internal_node[i].region = nullptr;
        }
    }
    else{
        for(int i = 0; i < this->elements; i++){
            if(this->data_leafs[i].polygon!=nullptr){
                delete this->data_leafs[i].polygon;
                this->data_leafs[i].polygon = nullptr;
                delete this->data_leafs[i].region;
                this->data_leafs[i].region = nullptr;
            }
        }
    }
}